

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

void __thiscall
Reader::parseexpression
          (Reader *this,iterator *it,iterator end,shared_ptr<Expression> *expr,bool isobj)

{
  double dVar1;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 aVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  pointer pPVar6;
  element_type *peVar7;
  undefined8 *puVar8;
  element_type *peVar9;
  element_type *peVar10;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  *p_Var11;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  *in_RSI;
  byte in_R8B;
  iterator next2_1;
  iterator next1_1;
  shared_ptr<QuadTerm> quadterm_3;
  string name2_1;
  string name1_1;
  shared_ptr<QuadTerm> quadterm_2;
  string name2;
  string name1;
  shared_ptr<QuadTerm> quadterm_1;
  string name_3;
  shared_ptr<QuadTerm> quadterm;
  string name_2;
  iterator next3;
  iterator next2;
  iterator next1;
  shared_ptr<LinTerm> linterm_1;
  string name_1;
  shared_ptr<LinTerm> linterm;
  string name;
  iterator next;
  QuadTerm *in_stack_fffffffffffffbe8;
  QuadTerm *in_stack_fffffffffffffbf0;
  value_type *in_stack_fffffffffffffbf8;
  vector<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>
  *in_stack_fffffffffffffc00;
  string *in_stack_fffffffffffffca0;
  Builder *in_stack_fffffffffffffca8;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  local_2a8;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  local_2a0;
  undefined1 local_298 [55];
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [87];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [87];
  allocator local_161;
  string local_160 [32];
  string local_140;
  undefined1 local_120 [24];
  string local_108 [32];
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  local_e8;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  local_e0;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  local_d8 [5];
  allocator local_a9;
  string local_a8 [87];
  allocator local_51;
  string local_50 [32];
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  local_30;
  byte local_21;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  *local_18;
  
  local_21 = in_R8B & 1;
  local_18 = in_RSI;
  bVar4 = __gnu_cxx::operator!=
                    ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                      *)in_stack_fffffffffffffbf0,
                     (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                      *)in_stack_fffffffffffffbe8);
  if ((bVar4) &&
     (pPVar6 = __gnu_cxx::
               __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
               ::operator->(local_18), pPVar6->type == CONID)) {
    pPVar6 = __gnu_cxx::
             __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
             ::operator->(local_18);
    pcVar3 = (pPVar6->field_1).name;
    peVar7 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )0x41d42e);
    std::__cxx11::string::operator=((string *)&peVar7->name,pcVar3);
    __gnu_cxx::
    __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
    ::operator++(local_18);
  }
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          bVar4 = __gnu_cxx::operator!=
                            ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                              *)in_stack_fffffffffffffbf0,
                             (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                              *)in_stack_fffffffffffffbe8);
          if (!bVar4) {
            return;
          }
          local_30._M_current = local_18->_M_current;
          __gnu_cxx::
          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
          ::operator++(&local_30);
          bVar4 = __gnu_cxx::operator!=
                            ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                              *)in_stack_fffffffffffffbf0,
                             (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                              *)in_stack_fffffffffffffbe8);
          if (((!bVar4) ||
              (pPVar6 = __gnu_cxx::
                        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                        ::operator->(local_18), pPVar6->type != CONST)) ||
             (pPVar6 = __gnu_cxx::
                       __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                       ::operator->(&local_30), pPVar6->type != VARID)) break;
          pPVar6 = __gnu_cxx::
                   __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                   ::operator->(&local_30);
          pcVar3 = (pPVar6->field_1).name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_50,pcVar3,&local_51);
          std::allocator<char>::~allocator((allocator<char> *)&local_51);
          puVar8 = (undefined8 *)operator_new(0x18);
          *puVar8 = 0;
          puVar8[1] = 0;
          puVar8[2] = 0;
          LinTerm::LinTerm((LinTerm *)in_stack_fffffffffffffbf0);
          std::shared_ptr<LinTerm>::shared_ptr<LinTerm,void>
                    ((shared_ptr<LinTerm> *)in_stack_fffffffffffffbf0,
                     (LinTerm *)in_stack_fffffffffffffbe8);
          pPVar6 = __gnu_cxx::
                   __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                   ::operator->(local_18);
          aVar2 = pPVar6->field_1;
          peVar9 = std::__shared_ptr_access<LinTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<LinTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x41d5a1);
          peVar9->coef = (double)aVar2;
          Builder::getvarbyname(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
          std::__shared_ptr_access<LinTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<LinTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x41d5ea);
          std::shared_ptr<Variable>::operator=
                    (&in_stack_fffffffffffffbf0->var1,&in_stack_fffffffffffffbe8->var1);
          std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41d60f);
          std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x41d61c);
          std::vector<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>::
          push_back(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
          __gnu_cxx::
          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
          ::operator++(local_18);
          __gnu_cxx::
          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
          ::operator++(local_18);
          std::shared_ptr<LinTerm>::~shared_ptr((shared_ptr<LinTerm> *)0x41d655);
          std::__cxx11::string::~string(local_50);
        }
        pPVar6 = __gnu_cxx::
                 __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                 ::operator->(local_18);
        if (pPVar6->type != CONST) break;
        pPVar6 = __gnu_cxx::
                 __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                 ::operator->(local_18);
        dVar1 = (pPVar6->field_1).value;
        peVar7 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x41d710);
        peVar7->offset = dVar1 + peVar7->offset;
        __gnu_cxx::
        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
        ::operator++(local_18);
      }
      pPVar6 = __gnu_cxx::
               __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
               ::operator->(local_18);
      if (pPVar6->type != VARID) break;
      pPVar6 = __gnu_cxx::
               __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
               ::operator->(local_18);
      pcVar3 = (pPVar6->field_1).name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,pcVar3,&local_a9);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      puVar8 = (undefined8 *)operator_new(0x18);
      *puVar8 = 0;
      puVar8[1] = 0;
      puVar8[2] = 0;
      LinTerm::LinTerm((LinTerm *)in_stack_fffffffffffffbf0);
      std::shared_ptr<LinTerm>::shared_ptr<LinTerm,void>
                ((shared_ptr<LinTerm> *)in_stack_fffffffffffffbf0,
                 (LinTerm *)in_stack_fffffffffffffbe8);
      peVar9 = std::__shared_ptr_access<LinTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<LinTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x41d7f8);
      peVar9->coef = 1.0;
      Builder::getvarbyname(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      std::__shared_ptr_access<LinTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<LinTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x41d841)
      ;
      std::shared_ptr<Variable>::operator=
                (&in_stack_fffffffffffffbf0->var1,&in_stack_fffffffffffffbe8->var1);
      std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41d866);
      std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x41d873);
      std::vector<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>::push_back
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator++(local_18);
      std::shared_ptr<LinTerm>::~shared_ptr((shared_ptr<LinTerm> *)0x41d89f);
      std::__cxx11::string::~string(local_a8);
    }
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                        *)in_stack_fffffffffffffbf0,
                       (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                        *)in_stack_fffffffffffffbe8);
    if (!bVar4) {
      return;
    }
    pPVar6 = __gnu_cxx::
             __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
             ::operator->(local_18);
    if (pPVar6->type != BRKOP) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
    ::operator++(local_18);
    while( true ) {
      bVar5 = __gnu_cxx::operator!=
                        ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          *)in_stack_fffffffffffffbf0,
                         (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          *)in_stack_fffffffffffffbe8);
      bVar4 = false;
      if (bVar5) {
        pPVar6 = __gnu_cxx::
                 __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                 ::operator->(local_18);
        bVar4 = pPVar6->type != BRKCL;
      }
      if (!bVar4) break;
      local_d8[0]._M_current = local_18->_M_current;
      local_e0._M_current = local_18->_M_current;
      local_e8._M_current = local_18->_M_current;
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator++(local_d8);
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator++(&local_e0);
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator++(&local_e8);
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          *)in_stack_fffffffffffffbf0,
                         (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          *)in_stack_fffffffffffffbe8);
      if (bVar4) {
        __gnu_cxx::
        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
        ::operator++(&local_e0);
        __gnu_cxx::
        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
        ::operator++(&local_e8);
      }
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          *)in_stack_fffffffffffffbf0,
                         (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          *)in_stack_fffffffffffffbe8);
      if (bVar4) {
        __gnu_cxx::
        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
        ::operator++(&local_e8);
      }
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          *)in_stack_fffffffffffffbf0,
                         (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          *)in_stack_fffffffffffffbe8);
      if (((bVar4) &&
          (pPVar6 = __gnu_cxx::
                    __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                    ::operator->(local_18), pPVar6->type == CONST)) &&
         ((pPVar6 = __gnu_cxx::
                    __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                    ::operator->(local_d8), pPVar6->type == VARID &&
          ((pPVar6 = __gnu_cxx::
                     __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                     ::operator->(&local_e0), pPVar6->type == HAT &&
           (pPVar6 = __gnu_cxx::
                     __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                     ::operator->(&local_e8), pPVar6->type == CONST)))))) {
        pPVar6 = __gnu_cxx::
                 __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                 ::operator->(local_d8);
        pcVar3 = (pPVar6->field_1).name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_108,pcVar3,(allocator *)(local_120 + 0x17));
        std::allocator<char>::~allocator((allocator<char> *)(local_120 + 0x17));
        __gnu_cxx::
        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
        ::operator->(&local_e8);
        lpassert(SUB81((ulong)in_stack_fffffffffffffc00 >> 0x38,0));
        puVar8 = (undefined8 *)operator_new(0x28);
        puVar8[2] = 0;
        puVar8[3] = 0;
        *puVar8 = 0;
        puVar8[1] = 0;
        puVar8[4] = 0;
        QuadTerm::QuadTerm(in_stack_fffffffffffffbf0);
        std::shared_ptr<QuadTerm>::shared_ptr<QuadTerm,void>
                  ((shared_ptr<QuadTerm> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
        pPVar6 = __gnu_cxx::
                 __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                 ::operator->(local_18);
        aVar2 = pPVar6->field_1;
        peVar10 = std::__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x41dbe1);
        peVar10->coef = (double)aVar2;
        Builder::getvarbyname(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
        std::__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x41dc22);
        std::shared_ptr<Variable>::operator=
                  (&in_stack_fffffffffffffbf0->var1,&in_stack_fffffffffffffbe8->var1);
        std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41dc47);
        Builder::getvarbyname(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
        in_stack_fffffffffffffca8 = (Builder *)local_120;
        std::__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x41dc82);
        in_stack_fffffffffffffca0 = &local_140;
        std::shared_ptr<Variable>::operator=
                  (&in_stack_fffffffffffffbf0->var1,&in_stack_fffffffffffffbe8->var1);
        std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41dcab);
        std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x41dcb8);
        std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>::
        push_back((vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_> *)
                  in_stack_fffffffffffffc00,(value_type *)in_stack_fffffffffffffbf8);
        p_Var11 = __gnu_cxx::
                  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                  ::operator++(&local_e8);
        local_18->_M_current = p_Var11->_M_current;
        std::shared_ptr<QuadTerm>::~shared_ptr((shared_ptr<QuadTerm> *)0x41dcf9);
        std::__cxx11::string::~string(local_108);
      }
      else {
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_fffffffffffffbf0,
                           (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_fffffffffffffbe8);
        if ((bVar4) &&
           (((pPVar6 = __gnu_cxx::
                       __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                       ::operator->(local_18), pPVar6->type == VARID &&
             (pPVar6 = __gnu_cxx::
                       __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                       ::operator->(local_d8), pPVar6->type == HAT)) &&
            (pPVar6 = __gnu_cxx::
                      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                      ::operator->(&local_e0), pPVar6->type == CONST)))) {
          pPVar6 = __gnu_cxx::
                   __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                   ::operator->(local_18);
          pcVar3 = (pPVar6->field_1).name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_160,pcVar3,&local_161);
          std::allocator<char>::~allocator((allocator<char> *)&local_161);
          __gnu_cxx::
          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
          ::operator->(&local_e0);
          lpassert(SUB81((ulong)in_stack_fffffffffffffc00 >> 0x38,0));
          puVar8 = (undefined8 *)operator_new(0x28);
          puVar8[2] = 0;
          puVar8[3] = 0;
          *puVar8 = 0;
          puVar8[1] = 0;
          puVar8[4] = 0;
          QuadTerm::QuadTerm(in_stack_fffffffffffffbf0);
          std::shared_ptr<QuadTerm>::shared_ptr<QuadTerm,void>
                    ((shared_ptr<QuadTerm> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
          peVar10 = std::__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x41debb);
          peVar10->coef = 1.0;
          Builder::getvarbyname(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
          std::__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x41defc);
          std::shared_ptr<Variable>::operator=
                    (&in_stack_fffffffffffffbf0->var1,&in_stack_fffffffffffffbe8->var1);
          std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41df21);
          Builder::getvarbyname(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
          std::__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x41df5c);
          std::shared_ptr<Variable>::operator=
                    (&in_stack_fffffffffffffbf0->var1,&in_stack_fffffffffffffbe8->var1);
          std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41df85);
          std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x41df92);
          std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>::
          push_back((vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>
                     *)in_stack_fffffffffffffc00,(value_type *)in_stack_fffffffffffffbf8);
          local_18->_M_current = local_e8._M_current;
          std::shared_ptr<QuadTerm>::~shared_ptr((shared_ptr<QuadTerm> *)0x41dfc8);
          std::__cxx11::string::~string(local_160);
        }
        else {
          bVar4 = __gnu_cxx::operator!=
                            ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                              *)in_stack_fffffffffffffbf0,
                             (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                              *)in_stack_fffffffffffffbe8);
          if (((bVar4) &&
              (pPVar6 = __gnu_cxx::
                        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                        ::operator->(local_18), pPVar6->type == CONST)) &&
             ((pPVar6 = __gnu_cxx::
                        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                        ::operator->(local_d8), pPVar6->type == VARID &&
              ((pPVar6 = __gnu_cxx::
                         __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                         ::operator->(&local_e0), pPVar6->type == ASTERISK &&
               (pPVar6 = __gnu_cxx::
                         __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                         ::operator->(&local_e8), pPVar6->type == VARID)))))) {
            pPVar6 = __gnu_cxx::
                     __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                     ::operator->(local_d8);
            pcVar3 = (pPVar6->field_1).name;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1b8,pcVar3,&local_1b9);
            std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
            pPVar6 = __gnu_cxx::
                     __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                     ::operator->(&local_e8);
            pcVar3 = (pPVar6->field_1).name;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1e0,pcVar3,&local_1e1);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
            puVar8 = (undefined8 *)operator_new(0x28);
            puVar8[2] = 0;
            puVar8[3] = 0;
            *puVar8 = 0;
            puVar8[1] = 0;
            puVar8[4] = 0;
            QuadTerm::QuadTerm(in_stack_fffffffffffffbf0);
            std::shared_ptr<QuadTerm>::shared_ptr<QuadTerm,void>
                      ((shared_ptr<QuadTerm> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
            pPVar6 = __gnu_cxx::
                     __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                     ::operator->(local_18);
            aVar2 = pPVar6->field_1;
            peVar10 = std::__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x41e1c7);
            peVar10->coef = (double)aVar2;
            Builder::getvarbyname(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
            std::__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x41e205);
            std::shared_ptr<Variable>::operator=
                      (&in_stack_fffffffffffffbf0->var1,&in_stack_fffffffffffffbe8->var1);
            std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41e224);
            Builder::getvarbyname(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
            std::__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x41e25c);
            std::shared_ptr<Variable>::operator=
                      (&in_stack_fffffffffffffbf0->var1,&in_stack_fffffffffffffbe8->var1);
            std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41e27f);
            std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x41e28c);
            std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>::
            push_back((vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>
                       *)in_stack_fffffffffffffc00,(value_type *)in_stack_fffffffffffffbf8);
            p_Var11 = __gnu_cxx::
                      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                      ::operator++(&local_e8);
            local_18->_M_current = p_Var11->_M_current;
            std::shared_ptr<QuadTerm>::~shared_ptr((shared_ptr<QuadTerm> *)0x41e2ca);
            std::__cxx11::string::~string(local_1e0);
            std::__cxx11::string::~string(local_1b8);
          }
          else {
            bVar4 = __gnu_cxx::operator!=
                              ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                                *)in_stack_fffffffffffffbf0,
                               (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                                *)in_stack_fffffffffffffbe8);
            if ((!bVar4) ||
               (((pPVar6 = __gnu_cxx::
                           __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                           ::operator->(local_18), pPVar6->type != VARID ||
                 (pPVar6 = __gnu_cxx::
                           __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                           ::operator->(local_d8), pPVar6->type != ASTERISK)) ||
                (pPVar6 = __gnu_cxx::
                          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          ::operator->(&local_e0), pPVar6->type != VARID)))) break;
            pPVar6 = __gnu_cxx::
                     __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                     ::operator->(local_18);
            pcVar3 = (pPVar6->field_1).name;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_238,pcVar3,&local_239);
            std::allocator<char>::~allocator((allocator<char> *)&local_239);
            pPVar6 = __gnu_cxx::
                     __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                     ::operator->(&local_e0);
            pcVar3 = (pPVar6->field_1).name;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_260,pcVar3,&local_261);
            std::allocator<char>::~allocator((allocator<char> *)&local_261);
            in_stack_fffffffffffffc00 =
                 (vector<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_> *)
                 operator_new(0x28);
            (in_stack_fffffffffffffc00->
            super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            in_stack_fffffffffffffc00[1].
            super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (in_stack_fffffffffffffc00->
            super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>
            )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (in_stack_fffffffffffffc00->
            super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            in_stack_fffffffffffffc00[1].
            super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            QuadTerm::QuadTerm(in_stack_fffffffffffffbf0);
            std::shared_ptr<QuadTerm>::shared_ptr<QuadTerm,void>
                      ((shared_ptr<QuadTerm> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
            peVar10 = std::__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x41e4d2);
            peVar10->coef = 1.0;
            Builder::getvarbyname(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
            std::__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x41e513);
            in_stack_fffffffffffffbf8 = (value_type *)(local_298 + 0x10);
            std::shared_ptr<Variable>::operator=
                      (&in_stack_fffffffffffffbf0->var1,&in_stack_fffffffffffffbe8->var1);
            std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41e532);
            Builder::getvarbyname(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
            in_stack_fffffffffffffbf0 = (QuadTerm *)(local_298 + 0x20);
            std::__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<QuadTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x41e56a);
            in_stack_fffffffffffffbe8 = (QuadTerm *)local_298;
            std::shared_ptr<Variable>::operator=
                      (&in_stack_fffffffffffffbf0->var1,
                       (shared_ptr<Variable> *)in_stack_fffffffffffffbe8);
            std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41e58b);
            std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x41e598);
            std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>::
            push_back((vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>
                       *)in_stack_fffffffffffffc00,(value_type *)in_stack_fffffffffffffbf8);
            local_18->_M_current = local_e8._M_current;
            std::shared_ptr<QuadTerm>::~shared_ptr((shared_ptr<QuadTerm> *)0x41e5cb);
            std::__cxx11::string::~string(local_260);
            std::__cxx11::string::~string(local_238);
          }
        }
      }
    }
    if ((local_21 & 1) == 0) {
      __gnu_cxx::operator!=
                ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                  *)in_stack_fffffffffffffbf0,
                 (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                  *)in_stack_fffffffffffffbe8);
      lpassert(SUB81((ulong)in_stack_fffffffffffffc00 >> 0x38,0));
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator->(local_18);
      lpassert(SUB81((ulong)in_stack_fffffffffffffc00 >> 0x38,0));
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator++(local_18);
    }
    else {
      local_2a0._M_current = local_18->_M_current;
      local_2a8._M_current = local_18->_M_current;
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator++(&local_2a0);
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator++(&local_2a8);
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          *)in_stack_fffffffffffffbf0,
                         (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          *)in_stack_fffffffffffffbe8);
      if (bVar4) {
        __gnu_cxx::
        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
        ::operator++(&local_2a8);
      }
      __gnu_cxx::operator!=
                ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                  *)in_stack_fffffffffffffbf0,
                 (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                  *)in_stack_fffffffffffffbe8);
      lpassert(SUB81((ulong)in_stack_fffffffffffffc00 >> 0x38,0));
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator->(local_18);
      lpassert(SUB81((ulong)in_stack_fffffffffffffc00 >> 0x38,0));
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator->(&local_2a0);
      lpassert(SUB81((ulong)in_stack_fffffffffffffc00 >> 0x38,0));
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator->(&local_2a8);
      lpassert(SUB81((ulong)in_stack_fffffffffffffc00 >> 0x38,0));
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator->(&local_2a8);
      lpassert(SUB81((ulong)in_stack_fffffffffffffc00 >> 0x38,0));
      p_Var11 = __gnu_cxx::
                __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                ::operator++(&local_2a8);
      local_18->_M_current = p_Var11->_M_current;
    }
  } while( true );
}

Assistant:

void Reader::parseexpression(std::vector<ProcessedToken>::iterator& it,
                             std::vector<ProcessedToken>::iterator end,
                             std::shared_ptr<Expression> expr, bool isobj) {
  if (it != end && it->type == ProcessedTokenType::CONID) {
    expr->name = it->name;
    ++it;
  }

  while (it != end) {
    std::vector<ProcessedToken>::iterator next = it;
    ++next;
    // const var
    if (next != end && it->type == ProcessedTokenType::CONST &&
        next->type == ProcessedTokenType::VARID) {
      std::string name = next->name;

      std::shared_ptr<LinTerm> linterm =
          std::shared_ptr<LinTerm>(new LinTerm());
      linterm->coef = it->value;
      linterm->var = builder.getvarbyname(name);
      //	 printf("LpReader: Term   %+g %s\n", linterm->coef,
      //name.c_str());
      expr->linterms.push_back(linterm);

      ++it;
      ++it;
      continue;
    }

    // const
    if (it->type == ProcessedTokenType::CONST) {
      //      printf("LpReader: Offset change from %+g by %+g\n", expr->offset, it->value);
      expr->offset += it->value;
      ++it;
      continue;
    }

    // var
    if (it->type == ProcessedTokenType::VARID) {
      std::string name = it->name;

      std::shared_ptr<LinTerm> linterm =
          std::shared_ptr<LinTerm>(new LinTerm());
      linterm->coef = 1.0;
      linterm->var = builder.getvarbyname(name);
      //	 printf("LpReader: Term   %+g %s\n", linterm->coef,
      //name.c_str());
      expr->linterms.push_back(linterm);

      ++it;
      continue;
    }

    // quadratic expression
    if (next != end && it->type == ProcessedTokenType::BRKOP) {
      ++it;
      while (it != end && it->type != ProcessedTokenType::BRKCL) {
        // const var hat const
        std::vector<ProcessedToken>::iterator next1 = it;  // token after it
        std::vector<ProcessedToken>::iterator next2 = it;  // token 2nd-after it
        std::vector<ProcessedToken>::iterator next3 = it;  // token 3rd-after it
        ++next1;
        ++next2;
        ++next3;
        if (next1 != end) {
          ++next2;
          ++next3;
        }
        if (next2 != end) ++next3;

        if (next3 != end && it->type == ProcessedTokenType::CONST &&
            next1->type == ProcessedTokenType::VARID &&
            next2->type == ProcessedTokenType::HAT &&
            next3->type == ProcessedTokenType::CONST) {
          std::string name = next1->name;

          lpassert(next3->value == 2.0);

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = it->value;
          quadterm->var1 = builder.getvarbyname(name);
          quadterm->var2 = builder.getvarbyname(name);
          expr->quadterms.push_back(quadterm);

          it = ++next3;
          continue;
        }

        // var hat const
        if (next2 != end && it->type == ProcessedTokenType::VARID &&
            next1->type == ProcessedTokenType::HAT &&
            next2->type == ProcessedTokenType::CONST) {
          std::string name = it->name;

          lpassert(next2->value == 2.0);

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = 1.0;
          quadterm->var1 = builder.getvarbyname(name);
          quadterm->var2 = builder.getvarbyname(name);
          expr->quadterms.push_back(quadterm);

          it = next3;
          continue;
        }

        // const var asterisk var
        if (next3 != end && it->type == ProcessedTokenType::CONST &&
            next1->type == ProcessedTokenType::VARID &&
            next2->type == ProcessedTokenType::ASTERISK &&
            next3->type == ProcessedTokenType::VARID) {
          std::string name1 = next1->name;
          std::string name2 = next3->name;

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = it->value;
          quadterm->var1 = builder.getvarbyname(name1);
          quadterm->var2 = builder.getvarbyname(name2);
          expr->quadterms.push_back(quadterm);

          it = ++next3;
          continue;
        }

        // var asterisk var
        if (next2 != end && it->type == ProcessedTokenType::VARID &&
            next1->type == ProcessedTokenType::ASTERISK &&
            next2->type == ProcessedTokenType::VARID) {
          std::string name1 = it->name;
          std::string name2 = next2->name;

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = 1.0;
          quadterm->var1 = builder.getvarbyname(name1);
          quadterm->var2 = builder.getvarbyname(name2);
          expr->quadterms.push_back(quadterm);

          it = next3;
          continue;
        }
        break;
      }
      if (isobj) {
        // only in the objective function, a quadratic term is followed by
        // "/2.0"
        std::vector<ProcessedToken>::iterator next1 = it;  // token after it
        std::vector<ProcessedToken>::iterator next2 = it;  // token 2nd-after it
        ++next1;
        ++next2;
        if (next1 != end) ++next2;

        lpassert(next2 != end);
        lpassert(it->type == ProcessedTokenType::BRKCL);
        lpassert(next1->type == ProcessedTokenType::SLASH);
        lpassert(next2->type == ProcessedTokenType::CONST);
        lpassert(next2->value == 2.0);
        it = ++next2;
      } else {
        lpassert(it != end);
        lpassert(it->type == ProcessedTokenType::BRKCL);
        ++it;
      }
      continue;
    }

    break;
  }
}